

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void normalize_suite::normalize_increasing(void)

{
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  basic_iterator<int> first_end_05;
  basic_iterator<int> first_end_06;
  basic_iterator<int> first_end_07;
  basic_iterator<int> first_end_08;
  basic_iterator<int> first_end_09;
  basic_iterator<int> first_end_10;
  basic_iterator<int> first_end_11;
  basic_iterator<int> first_end_12;
  basic_iterator<int> first_end_13;
  basic_iterator<int> first_end_14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_06;
  reference piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  initializer_list<int> input_02;
  initializer_list<int> __l_02;
  initializer_list<int> input_03;
  initializer_list<int> __l_03;
  initializer_list<int> input_04;
  initializer_list<int> __l_04;
  initializer_list<int> input_05;
  initializer_list<int> __l_05;
  initializer_list<int> input_06;
  initializer_list<int> __l_06;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  basic_iterator<int> first_begin_05;
  basic_iterator<int> first_begin_06;
  basic_iterator<int> first_begin_07;
  basic_iterator<int> first_begin_08;
  basic_iterator<int> first_begin_09;
  basic_iterator<int> first_begin_10;
  basic_iterator<int> first_begin_11;
  basic_iterator<int> first_begin_12;
  basic_iterator<int> first_begin_13;
  basic_iterator<int> first_begin_14;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> expect;
  array<int,_4UL> array;
  allocator_type local_199;
  circular_view<int,_18446744073709551615UL> local_198;
  vector<int,_std::allocator<int>_> local_178;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  int local_158 [6];
  int local_140 [4];
  circular_view<int,_18446744073709551615UL> *local_130;
  size_type sStack_128;
  circular_view<int,_18446744073709551615UL> *local_120;
  size_type sStack_118;
  circular_view<int,_18446744073709551615UL> *local_110;
  size_type sStack_108;
  circular_view<int,_18446744073709551615UL> *local_100;
  size_type sStack_f8;
  circular_view<int,_18446744073709551615UL> *local_f0;
  size_type sStack_e8;
  circular_view<int,_18446744073709551615UL> *local_e0;
  size_type sStack_d8;
  circular_view<int,_18446744073709551615UL> *local_d0;
  size_type sStack_c8;
  circular_view<int,_18446744073709551615UL> *local_c0;
  size_type sStack_b8;
  circular_view<int,_18446744073709551615UL> *local_b0;
  size_type sStack_a8;
  circular_view<int,_18446744073709551615UL> *local_a0;
  size_type sStack_98;
  circular_view<int,_18446744073709551615UL> *local_90;
  size_type sStack_88;
  circular_view<int,_18446744073709551615UL> *local_80;
  size_type sStack_78;
  circular_view<int,_18446744073709551615UL> *local_70;
  size_type sStack_68;
  circular_view<int,_18446744073709551615UL> *local_60;
  size_type sStack_58;
  circular_view<int,_18446744073709551615UL> *local_50;
  size_type sStack_48;
  circular_view<int,_18446744073709551615UL> *local_40;
  size_type sStack_38;
  
  local_158[0] = 0;
  local_158[1] = 0;
  local_158[2] = 0;
  local_158[3] = 0;
  local_198.member.cap = 4;
  local_198.member.size = 0;
  local_198.member.next = 4;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)&local_178;
  local_198.member.data = local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd95,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd97,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_38 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_38 = local_198.member.next % uVar2;
  }
  second_end._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current = sStack_38;
  first_end.parent = &local_198;
  first_begin.current = uVar4;
  first_begin.parent = &local_198;
  local_40 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd9b,"void normalize_suite::normalize_increasing()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_48 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_48 = local_198.member.next % uVar2;
  }
  first_end_00.current = sStack_48;
  first_end_00.parent = &local_198;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_198;
  local_50 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd9d,"void normalize_suite::normalize_increasing()",first_begin_00,first_end_00,
             local_158,local_158 + local_198.member.size);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  input_00._M_len = 2;
  input_00._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_00);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda2,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda4,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0xb;
  local_140[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_00,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_58 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_58 = local_198.member.next % uVar2;
  }
  second_end_00._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_00._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_01.current = sStack_58;
  first_end_01.parent = &local_198;
  first_begin_01.current = uVar4;
  first_begin_01.parent = &local_198;
  local_60 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda8,"void normalize_suite::normalize_increasing()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_00);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_68 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_68 = local_198.member.next % uVar2;
  }
  first_end_02.current = sStack_68;
  first_end_02.parent = &local_198;
  first_begin_02.current = uVar4;
  first_begin_02.parent = &local_198;
  local_70 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdaa,"void normalize_suite::normalize_increasing()",first_begin_02,first_end_02,
             local_158,local_158 + local_198.member.size);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input_01._M_len = 3;
  input_01._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_01);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdaf,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb1,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0xb;
  local_140[1] = 0x16;
  local_140[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_01,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_78 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_78 = local_198.member.next % uVar2;
  }
  second_end_01._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_01._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_03.current = sStack_78;
  first_end_03.parent = &local_198;
  first_begin_03.current = uVar4;
  first_begin_03.parent = &local_198;
  local_80 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb5,"void normalize_suite::normalize_increasing()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_01);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_88 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_88 = local_198.member.next % uVar2;
  }
  first_end_04.current = sStack_88;
  first_end_04.parent = &local_198;
  first_begin_04.current = uVar4;
  first_begin_04.parent = &local_198;
  local_90 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb7,"void normalize_suite::normalize_increasing()",first_begin_04,first_end_04,
             local_158,local_158 + local_198.member.size);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_02._M_len = 4;
  input_02._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_02);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdbc,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdbe,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0xb;
  local_140[1] = 0x16;
  local_140[2] = 0x21;
  local_140[3] = 0x2c;
  __l_02._M_len = 4;
  __l_02._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_02,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_98 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_98 = local_198.member.next % uVar2;
  }
  second_end_02._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_02._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_05.current = sStack_98;
  first_end_05.parent = &local_198;
  first_begin_05.current = uVar4;
  first_begin_05.parent = &local_198;
  local_a0 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc2,"void normalize_suite::normalize_increasing()",first_begin_05,first_end_05,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_02);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_a8 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_a8 = local_198.member.next % uVar2;
  }
  first_end_06.current = sStack_a8;
  first_end_06.parent = &local_198;
  first_begin_06.current = uVar4;
  first_begin_06.parent = &local_198;
  local_b0 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc4,"void normalize_suite::normalize_increasing()",first_begin_06,first_end_06,
             local_158,local_158 + 4);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input_03._M_len = 5;
  input_03._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_03);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc9,"void normalize_suite::normalize_increasing()",piVar1 != local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdcb,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0x16;
  local_140[1] = 0x21;
  local_140[2] = 0x2c;
  local_140[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_03,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_b8 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_b8 = local_198.member.next % uVar2;
  }
  second_end_03._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_03._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_07.current = sStack_b8;
  first_end_07.parent = &local_198;
  first_begin_07.current = uVar4;
  first_begin_07.parent = &local_198;
  local_c0 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdcf,"void normalize_suite::normalize_increasing()",first_begin_07,first_end_07,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_03);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_c8 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_c8 = local_198.member.next % uVar2;
  }
  first_end_08.current = sStack_c8;
  first_end_08.parent = &local_198;
  first_begin_08.current = uVar4;
  first_begin_08.parent = &local_198;
  local_d0 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd1,"void normalize_suite::normalize_increasing()",first_begin_08,first_end_08,
             local_158,local_158 + 4);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  input_04._M_len = 6;
  input_04._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_04);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd6,"void normalize_suite::normalize_increasing()",piVar1 != local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd8,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0x21;
  local_140[1] = 0x2c;
  local_140[2] = 0x37;
  local_140[3] = 0x42;
  __l_04._M_len = 4;
  __l_04._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_04,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_d8 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_d8 = local_198.member.next % uVar2;
  }
  second_end_04._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_04._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_09.current = sStack_d8;
  first_end_09.parent = &local_198;
  first_begin_09.current = uVar4;
  first_begin_09.parent = &local_198;
  local_e0 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xddc,"void normalize_suite::normalize_increasing()",first_begin_09,first_end_09,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_04);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_e8 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_e8 = local_198.member.next % uVar2;
  }
  first_end_10.current = sStack_e8;
  first_end_10.parent = &local_198;
  first_begin_10.current = uVar4;
  first_begin_10.parent = &local_198;
  local_f0 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdde,"void normalize_suite::normalize_increasing()",first_begin_10,first_end_10,
             local_158,local_158 + 4);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  uStack_160 = 0x4d;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_05._M_len = 7;
  input_05._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_05);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde3,"void normalize_suite::normalize_increasing()",piVar1 != local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde5,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0x2c;
  local_140[1] = 0x37;
  local_140[2] = 0x42;
  local_140[3] = 0x4d;
  __l_05._M_len = 4;
  __l_05._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_05,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_f8 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_f8 = local_198.member.next % uVar2;
  }
  second_end_05._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_05._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_11.current = sStack_f8;
  first_end_11.parent = &local_198;
  first_begin_11.current = uVar4;
  first_begin_11.parent = &local_198;
  local_100 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde9,"void normalize_suite::normalize_increasing()",first_begin_11,first_end_11,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_05);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_108 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_108 = local_198.member.next % uVar2;
  }
  first_end_12.current = sStack_108;
  first_end_12.parent = &local_198;
  first_begin_12.current = uVar4;
  first_begin_12.parent = &local_198;
  local_110 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdeb,"void normalize_suite::normalize_increasing()",first_begin_12,first_end_12,
             local_158,local_158 + 4);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  uStack_160 = 0x4d;
  uStack_15c = 0x58;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_06._M_len = 8;
  input_06._M_array = (iterator)&local_178;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_198,input_06);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf0,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_198);
  uVar2 = local_198.member.cap * 2;
  if ((uVar2 & local_198.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar2 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_198;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_178);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf2,"void normalize_suite::normalize_increasing()",piVar1 == local_158);
  local_140[0] = 0x37;
  local_140[1] = 0x42;
  local_140[2] = 0x4d;
  local_140[3] = 0x58;
  __l_06._M_len = 4;
  __l_06._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_06,&local_199);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_118 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_118 = local_198.member.next % uVar2;
  }
  second_end_06._M_current._4_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_06._M_current._0_4_ =
       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_13.current = sStack_118;
  first_end_13.parent = &local_198;
  first_begin_13.current = uVar4;
  first_begin_13.parent = &local_198;
  local_120 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf6,"void normalize_suite::normalize_increasing()",first_begin_13,first_end_13,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_06);
  uVar2 = local_198.member.cap * 2;
  uVar3 = uVar2 - (local_198.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_198.member.next - local_198.member.size;
  }
  else {
    uVar4 = (local_198.member.next - local_198.member.size) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_128 = uVar2 - 1 & local_198.member.next;
  }
  else {
    sStack_128 = local_198.member.next % uVar2;
  }
  first_end_14.current = sStack_128;
  first_end_14.parent = &local_198;
  first_begin_14.current = uVar4;
  first_begin_14.parent = &local_198;
  local_130 = &local_198;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf8,"void normalize_suite::normalize_increasing()",first_begin_14,first_end_14,
             local_158,local_158 + 4);
  if ((view_pointer)
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void normalize_increasing()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // 11 X X X => 11 X X X
        span = { 11 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 X X => 11 22 X X
        span = { 11, 22 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 33 X => 11 22 33 X
        span = { 11, 22, 33 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 33 44 => 11 22 33 44
        span = { 11, 22, 33, 44 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 22 33 44 => 22 33 44 55
        span = { 11, 22, 33, 44, 55 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 33 44 => 33 44 55 66
        span = { 11, 22, 33, 44, 55, 66 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44, 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 77 44 => 44 55 66 77
        span = { 11, 22, 33, 44, 55, 66, 77 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44, 55, 66, 77 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 77 88 => 55 66 77 88
        span = { 11, 22, 33, 44, 55, 66, 77, 88 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 55, 66, 77, 88 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
}